

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunction *
duckdb::StructDatePart::GetFunction<duckdb::dtime_tz_t>
          (ScalarFunction *__return_storage_ptr__,LogicalType *temporal_type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_f9;
  _Function_base local_f8;
  code *local_e0;
  LogicalType local_d8 [24];
  LogicalType local_c0 [24];
  LogicalType local_a8 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_90;
  LogicalType result_type;
  LogicalType part_type;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_48;
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_d8,VARCHAR);
  duckdb::LogicalType::LIST(&part_type);
  duckdb::LogicalType::~LogicalType(local_d8);
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duckdb::LogicalType::STRUCT(&result_type);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(&local_48);
  duckdb::LogicalType::LogicalType(local_d8,&part_type);
  duckdb::LogicalType::LogicalType(local_c0,temporal_type);
  __l._M_len = 2;
  __l._M_array = local_d8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_90,__l,&local_f9);
  duckdb::LogicalType::LogicalType(local_a8,&result_type);
  local_f8._M_functor._8_8_ = 0;
  local_f8._M_functor._M_unused._M_function_pointer = Function<duckdb::dtime_tz_t>;
  local_e0 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_f8._M_manager =
       std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  duckdb::LogicalType::LogicalType(local_30,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (__return_storage_ptr__,&local_90,local_a8,&local_f8,Bind,0,0,0,local_30,0,0,0);
  duckdb::LogicalType::~LogicalType(local_30);
  std::_Function_base::~_Function_base(&local_f8);
  duckdb::LogicalType::~LogicalType(local_a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_90);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_d8 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  __return_storage_ptr__->serialize = SerializeFunction;
  __return_storage_ptr__->deserialize = DeserializeFunction;
  duckdb::LogicalType::~LogicalType(&result_type);
  duckdb::LogicalType::~LogicalType(&part_type);
  return __return_storage_ptr__;
}

Assistant:

static ScalarFunction GetFunction(const LogicalType &temporal_type) {
		auto part_type = LogicalType::LIST(LogicalType::VARCHAR);
		auto result_type = LogicalType::STRUCT({});
		ScalarFunction result({part_type, temporal_type}, result_type, Function<INPUT_TYPE>, Bind);
		result.serialize = SerializeFunction;
		result.deserialize = DeserializeFunction;
		return result;
	}